

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

CappedArray<char,_8UL> __thiscall kj::_::Stringifier::operator*(Stringifier *this,short i)

{
  bool bVar1;
  ushort uVar2;
  char *pcVar3;
  uint8_t *puVar4;
  uint uVar5;
  uint8_t *puVar6;
  CappedArray<char,_8UL> CVar7;
  uint8_t reverse [7];
  CappedArray<char,_8UL> result;
  
  result.currentSize = 8;
  reverse[4] = '\0';
  reverse[5] = '\0';
  reverse[6] = '\0';
  reverse[0] = '\0';
  reverse[1] = '\0';
  reverse[2] = '\0';
  reverse[3] = '\0';
  if (i == 0) {
    puVar4 = reverse + 1;
    pcVar3 = result.content;
  }
  else {
    uVar2 = -i;
    if (0 < i) {
      uVar2 = i;
    }
    puVar4 = reverse;
    uVar5 = (uint)uVar2;
    do {
      *puVar4 = (char)uVar5 + (char)(uVar5 / 10) * -10;
      puVar4 = puVar4 + 1;
      bVar1 = 9 < uVar5;
      uVar5 = uVar5 / 10;
    } while (bVar1);
    pcVar3 = result.content;
    if (i < 0) {
      pcVar3 = result.content + 1;
      result.content[0] = '-';
    }
    if (puVar4 <= reverse) goto LAB_001b3bdd;
  }
  puVar6 = (uint8_t *)0x0;
  do {
    *pcVar3 = puVar4[(long)(puVar6 + -1)] + '0';
    pcVar3 = pcVar3 + 1;
    puVar6 = puVar6 + -1;
  } while (reverse + -(long)puVar4 != puVar6);
LAB_001b3bdd:
  CVar7.currentSize = (long)pcVar3 - (long)result.content;
  CVar7.content[1] = result.content[1];
  CVar7.content[2] = result.content[2];
  CVar7.content[3] = result.content[3];
  CVar7.content[4] = result.content[4];
  CVar7.content[5] = result.content[5];
  CVar7.content[6] = result.content[6];
  CVar7.content[7] = result.content[7];
  CVar7.content[0] = result.content[0];
  return CVar7;
}

Assistant:

inline explicit constexpr CappedArray(size_t s): currentSize(s) {}